

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void fmt::v7::print<char[109],unsigned_int&,unsigned_int&,float&,float&,char>
               (FILE *f,char (*format_str) [109],uint *args,uint *args_1,float *args_2,float *args_3
               )

{
  basic_string_view<char> format_str_00;
  format_args args_00;
  ulong local_58 [2];
  ulong local_48;
  ulong local_38;
  ulong local_28;
  
  local_58[0] = (ulong)*args;
  local_48 = (ulong)*args_1;
  local_38 = (ulong)(uint)*args_2;
  local_28 = (ulong)(uint)*args_3;
  format_str_00 = to_string_view<char,_0>(*format_str);
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       local_58;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = 0x9922;
  vprint(f,format_str_00,args_00);
  return;
}

Assistant:

inline void print(std::FILE* f, const S& format_str, Args&&... args) {
  const auto& vargs = fmt::make_args_checked<Args...>(format_str, args...);
  return detail::is_unicode<Char>()
             ? vprint(f, to_string_view(format_str), vargs)
             : detail::vprint_mojibake(f, to_string_view(format_str), vargs);
}